

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::WrinkledTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,WrinkledTexture *this)

{
  float *in_R9;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&,int_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ WrinkledTexture mapping: %s octaves: %d omega: %f ]",
             (char *)this,(TextureMapping3DHandle *)&this->octaves,(int *)&this->omega,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string WrinkledTexture::ToString() const {
    return StringPrintf("[ WrinkledTexture mapping: %s octaves: %d "
                        "omega: %f ]",
                        mapping, octaves, omega);
}